

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsTypesX.hpp
# Opt level: O0

GraphicsPipelineStateCreateInfoX * __thiscall
Diligent::GraphicsPipelineStateCreateInfoX::Clear(GraphicsPipelineStateCreateInfoX *this)

{
  undefined1 local_2c8 [8];
  GraphicsPipelineStateCreateInfoX CleanDesc;
  GraphicsPipelineStateCreateInfoX *this_local;
  
  CleanDesc.InputLayout.StringPool._M_h._M_single_bucket = (__node_base_ptr)this;
  GraphicsPipelineStateCreateInfoX((GraphicsPipelineStateCreateInfoX *)local_2c8);
  std::swap<Diligent::GraphicsPipelineStateCreateInfoX>
            (this,(GraphicsPipelineStateCreateInfoX *)local_2c8);
  ~GraphicsPipelineStateCreateInfoX((GraphicsPipelineStateCreateInfoX *)local_2c8);
  return this;
}

Assistant:

GraphicsPipelineStateCreateInfoX& Clear()
    {
        GraphicsPipelineStateCreateInfoX CleanDesc;
        std::swap(*this, CleanDesc);
        return *this;
    }